

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

Mat * RandomMat(int w,int h,int c)

{
  Mat *in_RDI;
  Mat *m;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  Mat *in_stack_ffffffffffffffe0;
  
  ncnn::Mat::Mat(in_stack_ffffffffffffffe0,(int)in_stack_ffffffffffffffdc,
                 (int)in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),(size_t)in_RDI,
                 (Allocator *)0x116b32);
  Randomize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

static ncnn::Mat RandomMat(int w, int h, int c)
{
    ncnn::Mat m(w, h, c);
    Randomize(m);
    return m;
}